

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall
CLOptions::AddVersionInfo
          (CLOptions *this,string *text_to_be_printed,string *param_name,string *param_descrip)

{
  long lVar1;
  ulong uVar2;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00
  ;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string version_opt_desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff40;
  string local_a0 [38];
  byte local_7a;
  allocator local_79;
  string local_78 [54];
  byte local_42;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  lVar1 = std::__cxx11::string::size();
  local_42 = 0;
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string(local_40,"version",&local_41);
  }
  else {
    std::__cxx11::string::string(local_40,local_18);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 0x100),local_40);
  std::__cxx11::string::~string(local_40);
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  uVar2 = std::__cxx11::string::empty();
  local_7a = 0;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(local_78,local_20);
  }
  else {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string(local_78,"Print version information and exit.",&local_79);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setParamName(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDescription(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_00 = (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 0x160);
  std::__cxx11::string::string(local_a0,local_10);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setValue(this_00,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void AddVersionInfo(const std::string& text_to_be_printed = "version text not set",
                        const std::string& param_name = "",
                        const std::string& param_descrip = "")
    {
        // Set the name of the parameter
        version_str = (param_name.size() > 0) ? param_name : "version" ;
        std::string version_opt_desc = (param_descrip.empty()) ? "Print version information and exit." : param_descrip ;
        
        // Set the actual parameter
        version_opt.setParamName(version_str) ;
        version_opt.setDescription(version_opt_desc) ;
        version_opt.setValue(text_to_be_printed) ;
    }